

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void ParseBag(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  int iVar1;
  uint uVar2;
  SFBag *pSVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  
  if ((chunklen & 3) == 0) {
    uVar5 = chunklen >> 2;
    if (chunkid == 0x67616269) {
      if (uVar5 != sf2->Instruments[(long)sf2->NumInstruments + -1].BagIndex + 1) goto LAB_003479b9;
      pSVar3 = (SFBag *)operator_new__((ulong)uVar5 * 0xc);
      sf2->InstrBags = pSVar3;
      sf2->NumInstrBags = uVar5;
    }
    else {
      if (chunkid != 0x67616270) {
        __assert_fail("chunkid == ID_ibag",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/timidity/instrum_sf2.cpp"
                      ,0x1f8,"void ParseBag(SFFile *, FileReader *, DWORD, DWORD)");
      }
      if (uVar5 != sf2->Presets[(long)sf2->NumPresets + -1].BagIndex + 1) goto LAB_003479b9;
      pSVar3 = (SFBag *)operator_new__((ulong)uVar5 * 0xc);
      sf2->PresetBags = pSVar3;
      sf2->NumPresetBags = uVar5;
    }
    lVar7 = 0;
    uVar6 = 0;
    while( true ) {
      bVar8 = uVar5 == 0;
      uVar5 = uVar5 - 1;
      if (bVar8) {
        return;
      }
      iVar1 = read_uword(f);
      *(short *)((long)&pSVar3->GenIndex + lVar7) = (short)iVar1;
      uVar2 = read_uword(f);
      if ((lVar7 != 0) &&
         ((uVar2 < uVar6 ||
          (*(ushort *)((long)&pSVar3->GenIndex + lVar7) <
           *(ushort *)((long)&pSVar3[-1].GenIndex + lVar7))))) break;
      *(undefined4 *)(&(pSVar3->KeyRange).Lo + lVar7) = 0x7f007f00;
      *(undefined4 *)((long)&pSVar3->Target + lVar7) = 0xffffffff;
      lVar7 = lVar7 + 0xc;
      uVar6 = uVar2;
    }
  }
LAB_003479b9:
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&CBadForm::typeinfo,0);
}

Assistant:

static void ParseBag(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	SFBag *bags, *bag;
	WORD prev_mod = 0;
	int numbags;
	int i;

	// Section 7.3, page 22:
	//		It is always a multiple of four bytes in length, and contains one
	//		record for each preset zone plus one record for a terminal zone. ...
	//		If the PBAG sub-chunk is missing, or its size is not a multiple of
	//		four bytes, the file should be rejected as structurally unsound.
	// Section 7.7: IBAG is the same, but substitute "instrument" for "preset".
	if (chunklen & 3)
	{
		throw CBadForm();
	}

	numbags = chunklen >> 2;

	if (chunkid == ID_pbag)
	{
		if (numbags != sf2->Presets[sf2->NumPresets - 1].BagIndex + 1)
		{
			throw CBadForm();
		}
		sf2->PresetBags = bags = new SFBag[numbags];
		sf2->NumPresetBags = numbags;
	}
	else
	{
		assert(chunkid == ID_ibag);
		if (numbags != sf2->Instruments[sf2->NumInstruments - 1].BagIndex + 1)
		{
			throw CBadForm();
		}
		sf2->InstrBags = bags = new SFBag[numbags];
		sf2->NumInstrBags = numbags;
	}

	for (bag = bags, i = numbags; i != 0; --i, ++bag)
	{
		bag->GenIndex = read_uword(f);
		WORD mod = read_uword(f);
		// Section 7.3, page 22:
		//		If the generator or modulator indices are non-monotonic or do not
		//		match the size of the respective PGEN or PMOD sub-chunks, the file
		//		is structurally defective and should be rejected at load time.
		if (bag != bags)
		{
			if (bag->GenIndex < (bag - 1)->GenIndex || mod < prev_mod)
			{
				throw CBadForm();
			}
		}
		prev_mod = mod;
		bag->KeyRange.Lo = bag->VelRange.Lo = 0;
		bag->KeyRange.Hi = bag->VelRange.Hi = 127;
		bag->Target = -1;
	}
}